

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char * __thiscall pugi::xml_parse_result::description(xml_parse_result *this)

{
  xml_parse_result *this_local;
  
  switch(this->status) {
  case status_ok:
    this_local = (xml_parse_result *)anon_var_dwarf_48b68;
    break;
  case status_file_not_found:
    this_local = (xml_parse_result *)anon_var_dwarf_48b7f;
    break;
  case status_io_error:
    this_local = (xml_parse_result *)anon_var_dwarf_48b96;
    break;
  case status_out_of_memory:
    this_local = (xml_parse_result *)anon_var_dwarf_48bad;
    break;
  case status_internal_error:
    this_local = (xml_parse_result *)anon_var_dwarf_48bc4;
    break;
  case status_unrecognized_tag:
    this_local = (xml_parse_result *)anon_var_dwarf_48bdb;
    break;
  case status_bad_pi:
    this_local = (xml_parse_result *)anon_var_dwarf_48be6;
    break;
  case status_bad_comment:
    this_local = (xml_parse_result *)anon_var_dwarf_48bfd;
    break;
  case status_bad_cdata:
    this_local = (xml_parse_result *)anon_var_dwarf_48c14;
    break;
  case status_bad_doctype:
    this_local = (xml_parse_result *)anon_var_dwarf_48c1f;
    break;
  case status_bad_pcdata:
    this_local = (xml_parse_result *)anon_var_dwarf_48c36;
    break;
  case status_bad_start_element:
    this_local = (xml_parse_result *)anon_var_dwarf_48c41;
    break;
  case status_bad_attribute:
    this_local = (xml_parse_result *)anon_var_dwarf_48c58;
    break;
  case status_bad_end_element:
    this_local = (xml_parse_result *)anon_var_dwarf_48c63;
    break;
  case status_end_element_mismatch:
    this_local = (xml_parse_result *)anon_var_dwarf_48c7a;
    break;
  case status_append_invalid_root:
    this_local = (xml_parse_result *)anon_var_dwarf_48c85;
    break;
  case status_no_document_element:
    this_local = (xml_parse_result *)anon_var_dwarf_48c90;
    break;
  default:
    this_local = (xml_parse_result *)anon_var_dwarf_48c9b;
  }
  return (char *)this_local;
}

Assistant:

PUGI__FN const char* xml_parse_result::description() const
	{
		switch (status)
		{
		case status_ok: return "No error";

		case status_file_not_found: return "File was not found";
		case status_io_error: return "Error reading from file/stream";
		case status_out_of_memory: return "Could not allocate memory";
		case status_internal_error: return "Internal error occurred";

		case status_unrecognized_tag: return "Could not determine tag type";

		case status_bad_pi: return "Error parsing document declaration/processing instruction";
		case status_bad_comment: return "Error parsing comment";
		case status_bad_cdata: return "Error parsing CDATA section";
		case status_bad_doctype: return "Error parsing document type declaration";
		case status_bad_pcdata: return "Error parsing PCDATA section";
		case status_bad_start_element: return "Error parsing start element tag";
		case status_bad_attribute: return "Error parsing element attribute";
		case status_bad_end_element: return "Error parsing end element tag";
		case status_end_element_mismatch: return "Start-end tags mismatch";

		case status_append_invalid_root: return "Unable to append nodes: root is not an element or document";

		case status_no_document_element: return "No document element found";

		default: return "Unknown error";
		}
	}